

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O0

void __thiscall
fm_ns_local_search::compute_gain
          (fm_ns_local_search *this,AdjList *G,NodeID node,Gain *toLHS,Gain *toRHS)

{
  int iVar1;
  bool bVar2;
  reference this_00;
  reference piVar3;
  reference pvVar4;
  int part_ind;
  int neighbor;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  Gain *toRHS_local;
  Gain *toLHS_local;
  NodeID node_local;
  AdjList *G_local;
  fm_ns_local_search *this_local;
  
  *toLHS = 1;
  *toRHS = 1;
  this_00 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](G,(long)node);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this_00);
  _part_ind = std::vector<int,_std::allocator<int>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&part_ind), bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar1 = *piVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->x,(long)iVar1);
    if (*pvVar4 < 0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this->partition_index,(long)iVar1)
      ;
      if (*pvVar4 == 0) {
        *toRHS = *toRHS + -1;
      }
      else if (*pvVar4 == 1) {
        *toLHS = *toLHS + -1;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::compute_gain( AdjList & G, NodeID node, Gain & toLHS, Gain & toRHS) {
        toLHS = 1;
        toRHS = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        int part_ind = partition_index[neighbor];
                        if (part_ind == 0) {
                                toRHS -= 1;
                        } else if (part_ind == 1) {
                                toLHS -= 1;
                        }
                }
        }
}